

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O0

int __thiscall
basisu::basisu_backend::find_video_frame(basisu_backend *this,int slice_index,int delta)

{
  uint32_t uVar1;
  basisu_backend_slice_desc *pbVar2;
  int in_EDX;
  long in_RDI;
  uint32_t s;
  size_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffc4;
  uint local_1c;
  
  local_1c = 0;
  do {
    uVar1 = vector<basisu::basisu_backend_slice_desc>::size
                      ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x20));
    if (uVar1 <= local_1c) {
      return -1;
    }
    pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    uVar1 = pbVar2->m_source_file_index;
    pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
    if (uVar1 == pbVar2->m_source_file_index + in_EDX) {
      pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      uVar1 = pbVar2->m_mip_index;
      pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                         ((vector<basisu::basisu_backend_slice_desc> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      if (uVar1 == pbVar2->m_mip_index) {
        pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        uVar1 = pbVar2->m_num_blocks_x;
        pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                           ((vector<basisu::basisu_backend_slice_desc> *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
        if (uVar1 == pbVar2->m_num_blocks_x) {
          pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                             ((vector<basisu::basisu_backend_slice_desc> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          in_stack_ffffffffffffffc4 = pbVar2->m_num_blocks_y;
          pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                             ((vector<basisu::basisu_backend_slice_desc> *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              in_stack_ffffffffffffffb8);
          if (in_stack_ffffffffffffffc4 == pbVar2->m_num_blocks_y) {
            pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                               ((vector<basisu::basisu_backend_slice_desc> *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
            in_stack_ffffffffffffffc0 = (uint)(pbVar2->m_alpha & 1);
            pbVar2 = vector<basisu::basisu_backend_slice_desc>::operator[]
                               ((vector<basisu::basisu_backend_slice_desc> *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
            if (in_stack_ffffffffffffffc0 == (pbVar2->m_alpha & 1)) {
              return local_1c;
            }
          }
        }
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int basisu_backend::find_video_frame(int slice_index, int delta)
	{
		for (uint32_t s = 0; s < m_slices.size(); s++)
		{
			if ((int)m_slices[s].m_source_file_index != ((int)m_slices[slice_index].m_source_file_index + delta))
				continue;
			if (m_slices[s].m_mip_index != m_slices[slice_index].m_mip_index)
				continue;

			// Being super paranoid here.
			if (m_slices[s].m_num_blocks_x != (m_slices[slice_index].m_num_blocks_x))
				continue;
			if (m_slices[s].m_num_blocks_y != (m_slices[slice_index].m_num_blocks_y))
				continue;
			if (m_slices[s].m_alpha != (m_slices[slice_index].m_alpha))
				continue;
			return s;
		}

		return -1;
	}